

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.cpp
# Opt level: O3

bool __thiscall cashew::Ref::operator==(Ref *this,string_view str)

{
  Value *pVVar1;
  bool in_CL;
  bool bVar2;
  string_view sVar3;
  
  pVVar1 = this->inst;
  if (pVVar1->type == String) {
    sVar3._M_str = (char *)0x1;
    sVar3._M_len = (size_t)str._M_str;
    sVar3 = ::wasm::IString::interned((IString *)str._M_len,sVar3,in_CL);
    bVar2 = (pVVar1->field_1).str.str._M_str == sVar3._M_str;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Ref::operator==(std::string_view str) {
  return get()->isString() && get()->str == str;
}